

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O0

bool __thiscall mkvparser::MkvReader::GetFileSize(MkvReader *this)

{
  long lVar1;
  long in_RDI;
  undefined1 local_1;
  
  if (*(long *)(in_RDI + 0x10) == 0) {
    local_1 = false;
  }
  else {
    fseek(*(FILE **)(in_RDI + 0x10),0,2);
    lVar1 = ftell(*(FILE **)(in_RDI + 0x10));
    *(long *)(in_RDI + 8) = lVar1;
    if (*(long *)(in_RDI + 8) < 0) {
      local_1 = false;
    }
    else {
      fseek(*(FILE **)(in_RDI + 0x10),0,0);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool MkvReader::GetFileSize() {
  if (m_file == NULL)
    return false;
#ifdef _MSC_VER
  int status = _fseeki64(m_file, 0L, SEEK_END);

  if (status)
    return false;  // error

  m_length = _ftelli64(m_file);
#else
  fseek(m_file, 0L, SEEK_END);
  m_length = ftell(m_file);
#endif
  assert(m_length >= 0);

  if (m_length < 0)
    return false;

#ifdef _MSC_VER
  status = _fseeki64(m_file, 0L, SEEK_SET);

  if (status)
    return false;  // error
#else
  fseek(m_file, 0L, SEEK_SET);
#endif

  return true;
}